

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

void __thiscall
cmGeneratorTarget::ComputeLinkInterfaceLibraries
          (cmGeneratorTarget *this,string *config,cmOptionalLinkInterface *iface,
          cmGeneratorTarget *headTarget,LinkInterfaceFor interfaceFor)

{
  cmLocalGenerator *pcVar1;
  cmLinkImplementationLibraries *rng;
  bool bVar2;
  PolicyStatus PVar3;
  TargetType TVar4;
  ulong uVar5;
  string *__rhs;
  const_iterator __first;
  const_iterator __last;
  ostream *poVar6;
  string *psVar7;
  PolicyID id;
  PolicyID id_00;
  cmBTStringRange cVar8;
  cmRange<__gnu_cxx::__normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  entries_00;
  bool local_839;
  byte local_74a;
  bool local_72d;
  string local_718;
  string local_6f8;
  undefined1 local_6d8 [8];
  ostringstream w_1;
  string_view local_560;
  undefined1 local_550 [8];
  string newLibraries;
  undefined1 local_520 [8];
  string oldLibraries;
  undefined1 local_4f0 [8];
  cmLinkInterface ifaceNew;
  __normal_iterator<cmLinkItem_*,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_> local_3e0;
  const_iterator local_3d8;
  cmLinkImplementationLibraries *local_3d0;
  cmLinkImplementationLibraries *impl;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *local_3c0;
  undefined1 local_3b8 [8];
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  entries;
  string local_368;
  string local_348;
  undefined1 local_328 [8];
  ostringstream w;
  allocator<char> local_1a9;
  string local_1a8;
  cmValue local_188;
  cmValue newExplicitLibraries;
  cmAlphaNum local_170;
  cmAlphaNum local_140;
  string local_110;
  cmBTStringRange local_f0;
  cmBTStringRange local_e0;
  cmBTStringRange local_d0;
  bool local_b9;
  undefined1 local_b8 [7];
  bool cmp0022NEW;
  string linkIfacePropCMP0022OLD;
  cmValue explicitLibrariesCMP0022OLD;
  undefined1 local_88 [7];
  bool haveExplicitLibraries;
  allocator<char> local_51;
  undefined1 local_50 [8];
  string suffix;
  LinkInterfaceFor interfaceFor_local;
  cmGeneratorTarget *headTarget_local;
  cmOptionalLinkInterface *iface_local;
  string *config_local;
  cmGeneratorTarget *this_local;
  
  suffix.field_2._12_4_ = interfaceFor;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_50,"_",&local_51);
  std::allocator<char>::~allocator(&local_51);
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) == 0) {
    cmsys::SystemTools::UpperCase((string *)local_88,config);
    std::__cxx11::string::operator+=((string *)local_50,(string *)local_88);
    std::__cxx11::string::~string((string *)local_88);
  }
  else {
    std::__cxx11::string::operator+=((string *)local_50,"NOCONFIG");
  }
  cmValue::cmValue((cmValue *)((long)&linkIfacePropCMP0022OLD.field_2 + 8));
  std::__cxx11::string::string((string *)local_b8);
  PVar3 = GetPolicyStatusCMP0022(this);
  local_72d = false;
  if (PVar3 != OLD) {
    PVar3 = GetPolicyStatusCMP0022(this);
    local_72d = PVar3 != WARN;
  }
  local_b9 = local_72d;
  if (local_72d == false) {
    TVar4 = GetType(this);
    if ((TVar4 == SHARED_LIBRARY) || (bVar2 = IsExecutableWithExports(this), bVar2)) {
      cmAlphaNum::cmAlphaNum(&local_140,"LINK_INTERFACE_LIBRARIES");
      cmAlphaNum::cmAlphaNum(&local_170,(string *)local_50);
      cmStrCat<>(&local_110,&local_140,&local_170);
      std::__cxx11::string::operator=((string *)local_b8,(string *)&local_110);
      std::__cxx11::string::~string((string *)&local_110);
      linkIfacePropCMP0022OLD.field_2._8_8_ = GetProperty(this,(string *)local_b8);
      bVar2 = cmValue::operator_cast_to_bool
                        ((cmValue *)((long)&linkIfacePropCMP0022OLD.field_2 + 8));
      if (!bVar2) {
        std::__cxx11::string::operator=((string *)local_b8,"LINK_INTERFACE_LIBRARIES");
        newExplicitLibraries = GetProperty(this,(string *)local_b8);
        linkIfacePropCMP0022OLD.field_2._8_8_ = newExplicitLibraries;
      }
    }
    bVar2 = cmValue::operator_cast_to_bool((cmValue *)((long)&linkIfacePropCMP0022OLD.field_2 + 8));
    if (((bVar2) && (PVar3 = GetPolicyStatusCMP0022(this), PVar3 == WARN)) &&
       ((this->PolicyWarnedCMP0022 & 1U) == 0)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1a8,"INTERFACE_LINK_LIBRARIES",&local_1a9);
      local_188 = GetProperty(this,&local_1a8);
      std::__cxx11::string::~string((string *)&local_1a8);
      std::allocator<char>::~allocator(&local_1a9);
      bVar2 = cmValue::operator_cast_to_bool(&local_188);
      if (bVar2) {
        psVar7 = cmValue::operator*[abi_cxx11_(&local_188);
        __rhs = cmValue::operator*[abi_cxx11_
                          ((cmValue *)((long)&linkIfacePropCMP0022OLD.field_2 + 8));
        bVar2 = std::operator!=(psVar7,__rhs);
        if (bVar2) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_328);
          cmPolicies::GetPolicyWarning_abi_cxx11_(&local_348,(cmPolicies *)0x16,id);
          poVar6 = std::operator<<((ostream *)local_328,(string *)&local_348);
          poVar6 = std::operator<<(poVar6,"\nTarget \"");
          psVar7 = GetName_abi_cxx11_(this);
          poVar6 = std::operator<<(poVar6,(string *)psVar7);
          poVar6 = std::operator<<(poVar6,
                                   "\" has an INTERFACE_LINK_LIBRARIES property which differs from its "
                                  );
          poVar6 = std::operator<<(poVar6,(string *)local_b8);
          poVar6 = std::operator<<(poVar6," properties.\nINTERFACE_LINK_LIBRARIES:\n  ");
          psVar7 = cmValue::operator*[abi_cxx11_(&local_188);
          poVar6 = std::operator<<(poVar6,(string *)psVar7);
          poVar6 = std::operator<<(poVar6,"\n");
          poVar6 = std::operator<<(poVar6,(string *)local_b8);
          poVar6 = std::operator<<(poVar6,":\n  ");
          psVar7 = cmValue::operator*[abi_cxx11_
                             ((cmValue *)((long)&linkIfacePropCMP0022OLD.field_2 + 8));
          poVar6 = std::operator<<(poVar6,(string *)psVar7);
          std::operator<<(poVar6,"\n");
          std::__cxx11::string::~string((string *)&local_348);
          pcVar1 = this->LocalGenerator;
          std::__cxx11::ostringstream::str();
          cmLocalGenerator::IssueMessage(pcVar1,AUTHOR_WARNING,&local_368);
          std::__cxx11::string::~string((string *)&local_368);
          this->PolicyWarnedCMP0022 = true;
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_328);
        }
      }
    }
    explicitLibrariesCMP0022OLD.Value._7_1_ =
         cmValue::operator_cast_to_bool((cmValue *)((long)&linkIfacePropCMP0022OLD.field_2 + 8));
  }
  else {
    local_d0 = cmTarget::GetLinkInterfaceEntries_abi_cxx11_(this->Target);
    bVar2 = cmRange<__gnu_cxx::__normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
            ::empty(&local_d0);
    local_74a = 1;
    if (bVar2) {
      local_e0 = cmTarget::GetLinkInterfaceDirectEntries_abi_cxx11_(this->Target);
      bVar2 = cmRange<__gnu_cxx::__normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
              ::empty(&local_e0);
      local_74a = 1;
      if (bVar2) {
        local_f0 = cmTarget::GetLinkInterfaceDirectExcludeEntries_abi_cxx11_(this->Target);
        bVar2 = cmRange<__gnu_cxx::__normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                ::empty(&local_f0);
        local_74a = bVar2 ^ 0xff;
      }
    }
    explicitLibrariesCMP0022OLD.Value._7_1_ = (bool)(local_74a & 1);
  }
  if (explicitLibrariesCMP0022OLD.Value._7_1_ == false) {
    TVar4 = GetType(this);
    if (TVar4 == EXECUTABLE) goto LAB_006cd5c8;
    TVar4 = GetType(this);
    if (TVar4 == MODULE_LIBRARY) goto LAB_006cd5c8;
  }
  (iface->super_cmLinkInterface).field_0xf4 = 1;
  local_839 = true;
  if ((local_b9 & 1U) == 0) {
    local_839 = cmValue::operator_cast_to_bool
                          ((cmValue *)((long)&linkIfacePropCMP0022OLD.field_2 + 8));
  }
  (iface->super_cmLinkInterface).field_0xf5 = local_839;
  if ((local_b9 & 1U) == 0) {
    bVar2 = cmValue::operator_cast_to_bool((cmValue *)((long)&linkIfacePropCMP0022OLD.field_2 + 8));
    if (bVar2) {
      std::
      vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::vector((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_3b8);
      psVar7 = cmValue::operator*[abi_cxx11_
                         ((cmValue *)((long)&linkIfacePropCMP0022OLD.field_2 + 8));
      std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
      emplace_back<std::__cxx11::string_const&>
                ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
                 local_3b8,psVar7);
      entries_00 = cmMakeRange<std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                             ((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)local_3b8);
      local_3c0 = (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)entries_00.End._M_current;
      impl = (cmLinkImplementationLibraries *)entries_00.Begin._M_current;
      ExpandLinkItems(this,(string *)local_b8,entries_00,config,headTarget,suffix.field_2._12_4_,
                      Libraries,&iface->super_cmLinkInterface);
      std::
      vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)local_3b8);
    }
  }
  else {
    cVar8 = cmTarget::GetLinkInterfaceEntries_abi_cxx11_(this->Target);
    ExpandLinkItems(this,(string *)(anonymous_namespace)::kINTERFACE_LINK_LIBRARIES_abi_cxx11_,cVar8
                    ,config,headTarget,suffix.field_2._12_4_,Libraries,&iface->super_cmLinkInterface
                   );
    cVar8 = cmTarget::GetLinkInterfaceDirectEntries_abi_cxx11_(this->Target);
    ExpandLinkItems(this,(string *)
                         (anonymous_namespace)::kINTERFACE_LINK_LIBRARIES_DIRECT_abi_cxx11_,cVar8,
                    config,headTarget,suffix.field_2._12_4_,HeadInclude,
                    &iface->super_cmLinkInterface);
    cVar8 = cmTarget::GetLinkInterfaceDirectExcludeEntries_abi_cxx11_(this->Target);
    entries.
    super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)cVar8.Begin._M_current;
    ExpandLinkItems(this,(string *)
                         (anonymous_namespace)::kINTERFACE_LINK_LIBRARIES_DIRECT_EXCLUDE_abi_cxx11_,
                    cVar8,config,headTarget,suffix.field_2._12_4_,HeadExclude,
                    &iface->super_cmLinkInterface);
  }
  if (((iface->super_cmLinkInterface).field_0xf5 & 1) == 0) {
    local_3d0 = GetLinkImplementationLibrariesInternal(this,config,headTarget,suffix.field_2._12_4_)
    ;
    if (local_3d0 != (cmLinkImplementationLibraries *)0x0) {
      local_3e0._M_current =
           (cmLinkItem *)
           std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::end
                     ((vector<cmLinkItem,_std::allocator<cmLinkItem>_> *)iface);
      __gnu_cxx::
      __normal_iterator<cmLinkItem_const*,std::vector<cmLinkItem,std::allocator<cmLinkItem>>>::
      __normal_iterator<cmLinkItem*>
                ((__normal_iterator<cmLinkItem_const*,std::vector<cmLinkItem,std::allocator<cmLinkItem>>>
                  *)&local_3d8,&local_3e0);
      __first = std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>::begin
                          (&local_3d0->Libraries);
      __last = std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>::end
                         (&local_3d0->Libraries);
      ifaceNew._240_8_ =
           std::vector<cmLinkItem,std::allocator<cmLinkItem>>::
           insert<__gnu_cxx::__normal_iterator<cmLinkImplItem_const*,std::vector<cmLinkImplItem,std::allocator<cmLinkImplItem>>>,void>
                     ((vector<cmLinkItem,std::allocator<cmLinkItem>> *)iface,local_3d8,
                      (__normal_iterator<const_cmLinkImplItem_*,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>
                       )__first._M_current,
                      (__normal_iterator<const_cmLinkImplItem_*,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>
                       )__last._M_current);
      PVar3 = GetPolicyStatusCMP0022(this);
      if (((PVar3 == WARN) && ((this->PolicyWarnedCMP0022 & 1U) == 0)) &&
         (suffix.field_2._12_4_ == 1)) {
        cmLinkInterface::cmLinkInterface((cmLinkInterface *)local_4f0);
        cVar8 = cmTarget::GetLinkInterfaceEntries_abi_cxx11_(this->Target);
        oldLibraries.field_2._8_8_ = cVar8.Begin._M_current;
        ExpandLinkItems(this,(string *)(anonymous_namespace)::kINTERFACE_LINK_LIBRARIES_abi_cxx11_,
                        cVar8,config,headTarget,suffix.field_2._12_4_,Libraries,
                        (cmLinkInterface *)local_4f0);
        bVar2 = std::operator!=((vector<cmLinkItem,_std::allocator<cmLinkItem>_> *)local_4f0,
                                (vector<cmLinkItem,_std::allocator<cmLinkItem>_> *)iface);
        rng = local_3d0;
        if (bVar2) {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)
                     ((long)&newLibraries.field_2 + 8),";");
          cmJoin<std::vector<cmLinkImplItem,std::allocator<cmLinkImplItem>>>
                    ((string *)local_520,&rng->Libraries,stack0xfffffffffffffad0);
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_560,";");
          cmJoin<std::vector<cmLinkItem,std::allocator<cmLinkItem>>>
                    ((string *)local_550,
                     (vector<cmLinkItem,_std::allocator<cmLinkItem>_> *)local_4f0,local_560);
          uVar5 = std::__cxx11::string::empty();
          if ((uVar5 & 1) != 0) {
            std::__cxx11::string::operator=((string *)local_520,"(empty)");
          }
          uVar5 = std::__cxx11::string::empty();
          if ((uVar5 & 1) != 0) {
            std::__cxx11::string::operator=((string *)local_550,"(empty)");
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_6d8);
          cmPolicies::GetPolicyWarning_abi_cxx11_(&local_6f8,(cmPolicies *)0x16,id_00);
          poVar6 = std::operator<<((ostream *)local_6d8,(string *)&local_6f8);
          poVar6 = std::operator<<(poVar6,"\nTarget \"");
          psVar7 = GetName_abi_cxx11_(this);
          poVar6 = std::operator<<(poVar6,(string *)psVar7);
          poVar6 = std::operator<<(poVar6,
                                   "\" has an INTERFACE_LINK_LIBRARIES property.  This should be preferred as the source of the link interface for this library but because CMP0022 is not set CMake is ignoring the property and using the link implementation as the link interface instead.\nINTERFACE_LINK_LIBRARIES:\n  "
                                  );
          poVar6 = std::operator<<(poVar6,(string *)local_550);
          poVar6 = std::operator<<(poVar6,"\nLink implementation:\n  ");
          poVar6 = std::operator<<(poVar6,(string *)local_520);
          std::operator<<(poVar6,"\n");
          std::__cxx11::string::~string((string *)&local_6f8);
          pcVar1 = this->LocalGenerator;
          std::__cxx11::ostringstream::str();
          cmLocalGenerator::IssueMessage(pcVar1,AUTHOR_WARNING,&local_718);
          std::__cxx11::string::~string((string *)&local_718);
          this->PolicyWarnedCMP0022 = true;
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_6d8);
          std::__cxx11::string::~string((string *)local_550);
          std::__cxx11::string::~string((string *)local_520);
        }
        cmLinkInterface::~cmLinkInterface((cmLinkInterface *)local_4f0);
      }
    }
  }
LAB_006cd5c8:
  std::__cxx11::string::~string((string *)local_b8);
  std::__cxx11::string::~string((string *)local_50);
  return;
}

Assistant:

void cmGeneratorTarget::ComputeLinkInterfaceLibraries(
  const std::string& config, cmOptionalLinkInterface& iface,
  cmGeneratorTarget const* headTarget, LinkInterfaceFor interfaceFor) const
{
  // Construct the property name suffix for this configuration.
  std::string suffix = "_";
  if (!config.empty()) {
    suffix += cmSystemTools::UpperCase(config);
  } else {
    suffix += "NOCONFIG";
  }

  // An explicit list of interface libraries may be set for shared
  // libraries and executables that export symbols.
  bool haveExplicitLibraries = false;
  cmValue explicitLibrariesCMP0022OLD;
  std::string linkIfacePropCMP0022OLD;
  bool const cmp0022NEW = (this->GetPolicyStatusCMP0022() != cmPolicies::OLD &&
                           this->GetPolicyStatusCMP0022() != cmPolicies::WARN);
  if (cmp0022NEW) {
    // CMP0022 NEW behavior is to use INTERFACE_LINK_LIBRARIES.
    haveExplicitLibraries = !this->Target->GetLinkInterfaceEntries().empty() ||
      !this->Target->GetLinkInterfaceDirectEntries().empty() ||
      !this->Target->GetLinkInterfaceDirectExcludeEntries().empty();
  } else {
    // CMP0022 OLD behavior is to use LINK_INTERFACE_LIBRARIES if set on a
    // shared lib or executable.
    if (this->GetType() == cmStateEnums::SHARED_LIBRARY ||
        this->IsExecutableWithExports()) {
      // Lookup the per-configuration property.
      linkIfacePropCMP0022OLD = cmStrCat("LINK_INTERFACE_LIBRARIES", suffix);
      explicitLibrariesCMP0022OLD = this->GetProperty(linkIfacePropCMP0022OLD);

      // If not set, try the generic property.
      if (!explicitLibrariesCMP0022OLD) {
        linkIfacePropCMP0022OLD = "LINK_INTERFACE_LIBRARIES";
        explicitLibrariesCMP0022OLD =
          this->GetProperty(linkIfacePropCMP0022OLD);
      }
    }

    if (explicitLibrariesCMP0022OLD &&
        this->GetPolicyStatusCMP0022() == cmPolicies::WARN &&
        !this->PolicyWarnedCMP0022) {
      // Compare the explicitly set old link interface properties to the
      // preferred new link interface property one and warn if different.
      cmValue newExplicitLibraries =
        this->GetProperty("INTERFACE_LINK_LIBRARIES");
      if (newExplicitLibraries &&
          (*newExplicitLibraries != *explicitLibrariesCMP0022OLD)) {
        std::ostringstream w;
        /* clang-format off */
        w << cmPolicies::GetPolicyWarning(cmPolicies::CMP0022) << "\n"
          "Target \"" << this->GetName() << "\" has an "
          "INTERFACE_LINK_LIBRARIES property which differs from its " <<
          linkIfacePropCMP0022OLD << " properties."
          "\n"
          "INTERFACE_LINK_LIBRARIES:\n"
          "  " << *newExplicitLibraries << "\n" <<
          linkIfacePropCMP0022OLD << ":\n"
          "  " << *explicitLibrariesCMP0022OLD << "\n";
        /* clang-format on */
        this->LocalGenerator->IssueMessage(MessageType::AUTHOR_WARNING,
                                           w.str());
        this->PolicyWarnedCMP0022 = true;
      }
    }

    haveExplicitLibraries = static_cast<bool>(explicitLibrariesCMP0022OLD);
  }

  // There is no implicit link interface for executables or modules
  // so if none was explicitly set then there is no link interface.
  if (!haveExplicitLibraries &&
      (this->GetType() == cmStateEnums::EXECUTABLE ||
       (this->GetType() == cmStateEnums::MODULE_LIBRARY))) {
    return;
  }
  iface.Exists = true;

  // If CMP0022 is NEW then the plain tll signature sets the
  // INTERFACE_LINK_LIBRARIES property.  Even if the project
  // clears it, the link interface is still explicit.
  iface.Explicit = cmp0022NEW || explicitLibrariesCMP0022OLD;

  if (cmp0022NEW) {
    // The interface libraries are specified by INTERFACE_LINK_LIBRARIES.
    // Use its special representation directly to get backtraces.
    this->ExpandLinkItems(
      kINTERFACE_LINK_LIBRARIES, this->Target->GetLinkInterfaceEntries(),
      config, headTarget, interfaceFor, LinkInterfaceField::Libraries, iface);
    this->ExpandLinkItems(kINTERFACE_LINK_LIBRARIES_DIRECT,
                          this->Target->GetLinkInterfaceDirectEntries(),
                          config, headTarget, interfaceFor,
                          LinkInterfaceField::HeadInclude, iface);
    this->ExpandLinkItems(kINTERFACE_LINK_LIBRARIES_DIRECT_EXCLUDE,
                          this->Target->GetLinkInterfaceDirectExcludeEntries(),
                          config, headTarget, interfaceFor,
                          LinkInterfaceField::HeadExclude, iface);
  } else if (explicitLibrariesCMP0022OLD) {
    // The interface libraries have been explicitly set in pre-CMP0022 style.
    std::vector<BT<std::string>> entries;
    entries.emplace_back(*explicitLibrariesCMP0022OLD);
    this->ExpandLinkItems(linkIfacePropCMP0022OLD, cmMakeRange(entries),
                          config, headTarget, interfaceFor,
                          LinkInterfaceField::Libraries, iface);
  }

  // If the link interface is explicit, do not fall back to the link impl.
  if (iface.Explicit) {
    return;
  }

  // The link implementation is the default link interface.
  if (cmLinkImplementationLibraries const* impl =
        this->GetLinkImplementationLibrariesInternal(config, headTarget,
                                                     interfaceFor)) {
    iface.Libraries.insert(iface.Libraries.end(), impl->Libraries.begin(),
                           impl->Libraries.end());
    if (this->GetPolicyStatusCMP0022() == cmPolicies::WARN &&
        !this->PolicyWarnedCMP0022 && interfaceFor == LinkInterfaceFor::Link) {
      // Compare the link implementation fallback link interface to the
      // preferred new link interface property and warn if different.
      cmLinkInterface ifaceNew;
      this->ExpandLinkItems(kINTERFACE_LINK_LIBRARIES,
                            this->Target->GetLinkInterfaceEntries(), config,
                            headTarget, interfaceFor,
                            LinkInterfaceField::Libraries, ifaceNew);
      if (ifaceNew.Libraries != iface.Libraries) {
        std::string oldLibraries = cmJoin(impl->Libraries, ";");
        std::string newLibraries = cmJoin(ifaceNew.Libraries, ";");
        if (oldLibraries.empty()) {
          oldLibraries = "(empty)";
        }
        if (newLibraries.empty()) {
          newLibraries = "(empty)";
        }

        std::ostringstream w;
        /* clang-format off */
        w << cmPolicies::GetPolicyWarning(cmPolicies::CMP0022) << "\n"
          "Target \"" << this->GetName() << "\" has an "
          "INTERFACE_LINK_LIBRARIES property.  "
          "This should be preferred as the source of the link interface "
          "for this library but because CMP0022 is not set CMake is "
          "ignoring the property and using the link implementation "
          "as the link interface instead."
          "\n"
          "INTERFACE_LINK_LIBRARIES:\n"
          "  " << newLibraries << "\n"
          "Link implementation:\n"
          "  " << oldLibraries << "\n";
        /* clang-format on */
        this->LocalGenerator->IssueMessage(MessageType::AUTHOR_WARNING,
                                           w.str());
        this->PolicyWarnedCMP0022 = true;
      }
    }
  }
}